

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProductEvaluators.h
# Opt level: O2

CoeffReturnType __thiscall
Eigen::internal::
product_evaluator<Eigen::Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>,_8,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
::coeff(product_evaluator<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1>,_8,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
        *this,Index row,Index col)

{
  Scalar SVar1;
  MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
  local_140 [56];
  Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> local_108;
  PointerType local_d0 [2];
  long local_c0;
  XprTypeNested local_b8;
  long lStack_b0;
  long local_a8;
  Index IStack_a0;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
  local_98;
  
  Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
            (&local_108,this->m_lhs,row);
  local_d0[0] = local_108.
                super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>
                .
                super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>
                .
                super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>
                .m_data;
  local_c0 = local_108.
             super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>
             .
             super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>
             .
             super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>
             .m_cols.m_value;
  local_b8 = local_108.
             super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>
             .
             super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>
             .m_xpr;
  lStack_b0 = local_108.
              super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>
              .
              super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>
              .m_startRow.m_value;
  local_a8 = local_108.
             super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>
             .
             super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>
             .m_startCol.m_value;
  IStack_a0 = local_108.
              super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>
              .
              super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>
              .m_outerStride;
  Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
            ((Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_140,
             this->m_rhs,col);
  MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1,-1,false>const>>
  ::cwiseProduct<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>>
            (&local_98,local_d0,local_140);
  SVar1 = DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>_>
          ::sum((DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                 *)&local_98);
  return SVar1;
}

Assistant:

const CoeffReturnType coeff(Index row, Index col) const
  {
    return (m_lhs.row(row).transpose().cwiseProduct( m_rhs.col(col) )).sum();
  }